

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O2

int __thiscall ncnn::Packing::load_param(Packing *this,ParamDict *pd)

{
  int iVar1;
  
  iVar1 = ParamDict::get(pd,0,1);
  this->out_elempack = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->use_padding = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->cast_type_from = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->cast_type_to = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->storage_type_from = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->storage_type_to = iVar1;
  return 0;
}

Assistant:

int Packing::load_param(const ParamDict& pd)
{
    out_elempack = pd.get(0, 1);
    use_padding = pd.get(1, 0);

    cast_type_from = pd.get(2, 0);
    cast_type_to = pd.get(3, 0);

    storage_type_from = pd.get(4, 0);
    storage_type_to = pd.get(5, 0);

    return 0;
}